

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::segment::Atlas::resetCharts(Atlas *this)

{
  uint32_t face;
  Chart *chart;
  int *piVar1;
  Chart **ppCVar2;
  uint *puVar3;
  uint32_t i;
  uint32_t uVar4;
  uint32_t index;
  uint uVar5;
  
  uVar5 = (this->m_mesh->m_indices).m_base.size / 3;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    piVar1 = Array<int>::operator[](&this->m_faceCharts,uVar4);
    *piVar1 = -1;
  }
  this->m_facesLeft = uVar5;
  uVar4 = (this->m_charts).m_base.size;
  for (index = 0; uVar4 != index; index = index + 1) {
    ppCVar2 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,index);
    chart = *ppCVar2;
    puVar3 = Array<unsigned_int>::back(&chart->seeds);
    face = *puVar3;
    (chart->faces).m_base.size = 0;
    (chart->candidates).m_pairs.m_base.size = 0;
    (chart->failedPlanarRegions).m_base.size = 0;
    (chart->centroidSum).y = 0.0;
    (chart->centroidSum).z = 0.0;
    (chart->centroid).x = 0.0;
    (chart->centroid).y = 0.0;
    *(undefined8 *)&(chart->basis).normal.z = 0;
    chart->boundaryLength = 0.0;
    (chart->centroidSum).x = 0.0;
    (chart->basis).bitangent.y = 0.0;
    (chart->basis).bitangent.z = 0.0;
    (chart->basis).normal.x = 0.0;
    (chart->basis).normal.y = 0.0;
    (chart->basis).tangent.x = 0.0;
    (chart->basis).tangent.y = 0.0;
    *(undefined8 *)&(chart->basis).tangent.z = 0;
    (chart->centroid).z = 0.0;
    addFaceToChart(this,chart,face);
  }
  return;
}

Assistant:

void resetCharts()
	{
		XA_PROFILE_START(buildAtlasResetCharts)
		const uint32_t faceCount = m_mesh->faceCount();
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceCharts[i] = -1;
		m_facesLeft = faceCount;
		const uint32_t chartCount = m_charts.size();
		for (uint32_t i = 0; i < chartCount; i++) {
			Chart *chart = m_charts[i];
			const uint32_t seed = chart->seeds.back();
			chart->area = 0.0f;
			chart->boundaryLength = 0.0f;
			chart->basis.normal = Vector3(0.0f);
			chart->basis.tangent = Vector3(0.0f);
			chart->basis.bitangent = Vector3(0.0f);
			chart->centroidSum = Vector3(0.0f);
			chart->centroid = Vector3(0.0f);
			chart->faces.clear();
			chart->candidates.clear();
			chart->failedPlanarRegions.clear();
			addFaceToChart(chart, seed);
		}
		XA_PROFILE_END(buildAtlasResetCharts)
	}